

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

size_t brotli::RemapBlockIds(uint8_t *block_ids,size_t length)

{
  iterator iVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  uint8_t *__k;
  size_t sVar4;
  bool bVar5;
  map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  new_id;
  _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  sVar4 = 0;
  sVar3 = length;
  __k = block_ids;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while (bVar5 = sVar3 != 0, sVar3 = sVar3 - 1, bVar5) {
    iVar1 = std::
            _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
            ::find(&local_60,__k);
    if ((_Rb_tree_header *)iVar1._M_node == &local_60._M_impl.super__Rb_tree_header) {
      pmVar2 = std::
               map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
               ::operator[]((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                             *)&local_60,__k);
      *pmVar2 = (mapped_type)sVar4;
      sVar4 = sVar4 + 1;
    }
    __k = __k + 1;
  }
  while (bVar5 = length != 0, length = length - 1, bVar5) {
    pmVar2 = std::
             map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
             ::operator[]((map<unsigned_char,_unsigned_char,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
                           *)&local_60,block_ids);
    *block_ids = *pmVar2;
    block_ids = block_ids + 1;
  }
  std::
  _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_unsigned_char>,_std::_Select1st<std::pair<const_unsigned_char,_unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_char>_>_>
  ::~_Rb_tree(&local_60);
  return sVar4;
}

Assistant:

size_t RemapBlockIds(uint8_t* block_ids, const size_t length) {
  std::map<uint8_t, uint8_t> new_id;
  size_t next_id = 0;
  for (size_t i = 0; i < length; ++i) {
    if (new_id.find(block_ids[i]) == new_id.end()) {
      new_id[block_ids[i]] = static_cast<uint8_t>(next_id);
      ++next_id;
    }
  }
  for (size_t i = 0; i < length; ++i) {
    block_ids[i] = new_id[block_ids[i]];
  }
  return next_id;
}